

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O1

void __thiscall Clone_importSource_Test::TestBody(Clone_importSource_Test *this)

{
  string *psVar1;
  char cVar2;
  undefined1 uVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  ImportSourcePtr i;
  ImportSourcePtr iClone;
  undefined1 local_88 [16];
  long local_78 [2];
  undefined1 local_68 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::ImportSource::create();
  psVar1 = local_38;
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"import","");
  libcellml::Entity::setId(psVar1);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"this_is_a_url","");
  libcellml::ImportSource::setUrl(local_38);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  libcellml::ImportSource::clone();
  libcellml::Entity::id_abi_cxx11_();
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_68,(internal *)"i->id()","iClone->id()",local_88,&local_58,
             in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  if (local_68[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((undefined8 *)local_68._8_8_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_68._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x20,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if ((long *)local_88._0_8_ != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_88._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_88._0_8_ + 8))();
      }
      local_88._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_68 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::ImportSource::url_abi_cxx11_();
  libcellml::ImportSource::url_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_68,(internal *)"i->url()","iClone->url()",local_88,&local_58,
             in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  if (local_68[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((undefined8 *)local_68._8_8_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_68._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x21,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if ((long *)local_88._0_8_ != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_88._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_88._0_8_ + 8))();
      }
      local_88._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_68 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar3 = libcellml::ImportSource::hasModel();
  local_58._M_dataplus._M_p._0_1_ = uVar3;
  local_68[0] = (AssertHelper)libcellml::ImportSource::hasModel();
  testing::internal::CmpHelperEQ<bool,bool>
            ((AssertionResult *)local_88,(internal *)"i->hasModel()","iClone->hasModel()",
             (char *)&local_58,(bool *)local_68,(bool *)in_R9);
  if (local_88[0] == (Message)0x0) {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_88._8_8_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_88._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x22,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_58._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
      }
      local_58._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_88 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  return;
}

Assistant:

TEST(Clone, importSource)
{
    auto i = libcellml::ImportSource::create();

    i->setId("import");
    i->setUrl("this_is_a_url");

    auto iClone = i->clone();

    EXPECT_EQ(i->id(), iClone->id());
    EXPECT_EQ(i->url(), iClone->url());
    EXPECT_EQ(i->hasModel(), iClone->hasModel());
}